

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalNinjaGenerator *this_00;
  pointer pbVar3;
  int iVar4;
  Value *pVVar5;
  long *plVar6;
  string *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer path;
  string tdin;
  Value tdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  cmGeneratedFileStream tdif;
  undefined1 local_498 [32];
  string *local_478;
  Value local_470;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  Value local_430;
  Value local_408;
  Value local_3e0;
  Value local_3b8;
  Value local_390;
  Value local_368;
  Value local_340;
  Value local_318;
  Value local_2f0;
  Value local_2c8;
  Value local_2a0;
  ValueHolder local_278;
  long local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [35];
  
  Json::Value::Value(&local_470,objectValue);
  local_478 = lang;
  Json::Value::Value(&local_2a0,lang);
  pVVar5 = Json::Value::operator[](&local_470,"language");
  Json::Value::operator=(pVVar5,&local_2a0);
  Json::Value::~Value(&local_2a0);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498,
                 "CMAKE_",local_478);
  plVar6 = (long *)std::__cxx11::string::append(local_498);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar8) {
    local_268[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_268[0]._8_8_ = plVar6[3];
    local_278.string_ = (char *)local_268;
  }
  else {
    local_268[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_278.string_ = ((char *)*plVar6).string_;
  }
  local_270 = plVar6[1];
  *plVar6 = (long)paVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  psVar7 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_278);
  Json::Value::Value(&local_2c8,psVar7);
  pVVar5 = Json::Value::operator[](&local_470,"compiler-id");
  Json::Value::operator=(pVVar5,&local_2c8);
  Json::Value::~Value(&local_2c8);
  if (local_278 != local_268) {
    operator_delete(local_278.string_,local_268[0]._M_allocated_capacity + 1);
  }
  if ((string *)local_498._0_8_ != (string *)(local_498 + 0x10)) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
  }
  iVar4 = std::__cxx11::string::compare((char *)local_478);
  if (iVar4 == 0) {
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar7 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)&local_278,pcVar2,psVar7);
    if (local_270 == 0) {
      cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                ((this->super_cmCommonTargetGenerator).Makefile);
      std::__cxx11::string::_M_assign((string *)&local_278.bool_);
    }
    Json::Value::Value(&local_2f0,(string *)&local_278);
    pVVar5 = Json::Value::operator[](&local_470,"module-dir");
    Json::Value::operator=(pVVar5,&local_2f0);
    Json::Value::~Value(&local_2f0);
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    local_498._0_8_ = local_498 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,"CMAKE_Fortran_SUBMODULE_SEP","");
    psVar7 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_498);
    Json::Value::Value(&local_318,psVar7);
    pVVar5 = Json::Value::operator[](&local_470,"submodule-sep");
    Json::Value::operator=(pVVar5,&local_318);
    Json::Value::~Value(&local_318);
    if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
      operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
    }
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    local_498._0_8_ = local_498 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,"CMAKE_Fortran_SUBMODULE_EXT","");
    psVar7 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_498);
    Json::Value::Value(&local_340,psVar7);
    pVVar5 = Json::Value::operator[](&local_470,"submodule-ext");
    Json::Value::operator=(pVVar5,&local_340);
    Json::Value::~Value(&local_340);
    if ((string *)local_498._0_8_ != (string *)(local_498 + 0x10)) {
      operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
    }
    if (local_278 != local_268) {
      operator_delete(local_278.string_,local_268[0]._M_allocated_capacity + 1);
    }
  }
  psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_368,psVar7);
  pVVar5 = Json::Value::operator[](&local_470,"dir-cur-bld");
  Json::Value::operator=(pVVar5,&local_368);
  Json::Value::~Value(&local_368);
  psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_390,psVar7);
  pVVar5 = Json::Value::operator[](&local_470,"dir-cur-src");
  Json::Value::operator=(pVVar5,&local_390);
  Json::Value::~Value(&local_390);
  psVar7 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_3b8,psVar7);
  pVVar5 = Json::Value::operator[](&local_470,"dir-top-bld");
  Json::Value::operator=(pVVar5,&local_3b8);
  Json::Value::~Value(&local_3b8);
  psVar7 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_3e0,psVar7);
  pVVar5 = Json::Value::operator[](&local_470,"dir-top-src");
  Json::Value::operator=(pVVar5,&local_3e0);
  Json::Value::~Value(&local_3e0);
  Json::Value::Value(&local_408,arrayValue);
  pVVar5 = Json::Value::operator[](&local_470,"include-dirs");
  pVVar5 = Json::Value::operator=(pVVar5,&local_408);
  Json::Value::~Value(&local_408);
  local_448.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_448.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_448.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  this_00 = this->LocalGenerator;
  psVar7 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this_00,&local_448,pcVar2,local_478,psVar7);
  pbVar3 = local_448.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_448.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_448.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    path = local_448.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      ConvertToNinjaPath((string *)local_498,this,path);
      Json::Value::Value((Value *)&local_278,(string *)local_498);
      Json::Value::append(pVVar5,(Value *)&local_278);
      Json::Value::~Value((Value *)&local_278);
      if ((string *)local_498._0_8_ != (string *)(local_498 + 0x10)) {
        operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
      }
      path = path + 1;
    } while (path != pbVar3);
  }
  Json::Value::Value(&local_430,arrayValue);
  pVVar5 = Json::Value::operator[](&local_470,"linked-target-dirs");
  pVVar5 = Json::Value::operator=(pVVar5,&local_430);
  Json::Value::~Value(&local_430);
  cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_498,&this->super_cmCommonTargetGenerator);
  if (local_498._0_8_ != local_498._8_8_) {
    psVar7 = (string *)local_498._0_8_;
    do {
      Json::Value::Value((Value *)&local_278,psVar7);
      Json::Value::append(pVVar5,(Value *)&local_278);
      Json::Value::~Value((Value *)&local_278);
      psVar7 = psVar7 + 1;
    } while (psVar7 != (string *)local_498._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_498);
  GetTargetDependInfoPath((string *)local_498,this,local_478);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&local_278,(string *)local_498,false,None);
  Json::operator<<((ostream *)&local_278,&local_470);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_278);
  if ((string *)local_498._0_8_ != (string *)(local_498 + 0x10)) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448);
  Json::Value::~Value(&local_470);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] =
    this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID");

  if (lang == "Fortran") {
    std::string mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
    if (mod_dir.empty()) {
      mod_dir = this->Makefile->GetCurrentBinaryDirectory();
    }
    tdi["module-dir"] = mod_dir;
    tdi["submodule-sep"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
    tdi["submodule-ext"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, this->GetConfigName());
  for (std::string const& i : includes) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  for (std::string const& l : this->GetLinkedTargetDirectories()) {
    tdi_linked_target_dirs.append(l);
  }

  std::string const tdin = this->GetTargetDependInfoPath(lang);
  cmGeneratedFileStream tdif(tdin);
  tdif << tdi;
}